

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * getblockstats(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  string description_31;
  string description_32;
  string description_33;
  string description_34;
  string description_35;
  string description_36;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_31;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_32;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_33;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_34;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_35;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_37;
  string description_38;
  string description_39;
  string description_40;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_36;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar35;
  long *plVar36;
  long lVar37;
  undefined8 uVar38;
  RPCHelpMan *in_RDI;
  long *plVar39;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffd358;
  undefined4 uVar40;
  undefined4 in_stack_ffffffffffffd35c;
  undefined1 *puVar41;
  undefined4 uVar42;
  undefined8 in_stack_ffffffffffffd360;
  undefined8 in_stack_ffffffffffffd370;
  RPCArg *pRVar43;
  undefined8 in_stack_ffffffffffffd378;
  undefined8 in_stack_ffffffffffffd380;
  undefined8 in_stack_ffffffffffffd388;
  code *pcVar44;
  undefined8 in_stack_ffffffffffffd390;
  undefined1 in_stack_ffffffffffffd398 [16];
  pointer in_stack_ffffffffffffd3a8;
  pointer pRVar45;
  pointer in_stack_ffffffffffffd3b0;
  pointer pRVar46;
  pointer in_stack_ffffffffffffd3b8;
  pointer pRVar47;
  pointer in_stack_ffffffffffffd3c0;
  pointer in_stack_ffffffffffffd3c8;
  pointer pRVar48;
  pointer in_stack_ffffffffffffd3d0;
  pointer pRVar49;
  pointer in_stack_ffffffffffffd3d8;
  pointer pRVar50;
  undefined8 in_stack_ffffffffffffd3e0;
  pointer in_stack_ffffffffffffd3e8;
  pointer in_stack_ffffffffffffd3f0;
  pointer in_stack_ffffffffffffd3f8;
  undefined8 in_stack_ffffffffffffd400;
  pointer in_stack_ffffffffffffd408;
  pointer in_stack_ffffffffffffd410;
  pointer in_stack_ffffffffffffd418;
  undefined8 in_stack_ffffffffffffd420;
  pointer in_stack_ffffffffffffd428;
  pointer in_stack_ffffffffffffd430;
  pointer in_stack_ffffffffffffd438;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2bb8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2af8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ad8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ab8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2998;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2978;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2958;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2938;
  allocator_type local_2919;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2918;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2898;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2880;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2868;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2848;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2828;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2808;
  vector<RPCResult,_std::allocator<RPCResult>_> local_27f0;
  RPCResults local_27d8;
  allocator_type local_27ba;
  allocator_type local_27b9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_27b8;
  allocator_type local_2799;
  vector<RPCArg,_std::allocator<RPCArg>_> local_2798;
  string local_2780;
  string local_2760;
  string local_2740;
  string local_2720;
  string local_2700;
  string local_26e0;
  string local_26c0;
  string local_26a0;
  string local_2680;
  string local_2660;
  string local_2640;
  string local_2620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e0;
  ulong *local_25c0;
  undefined8 local_25b8;
  ulong local_25b0;
  undefined8 uStack_25a8;
  ulong *local_25a0;
  size_type local_2598;
  ulong local_2590;
  undefined8 uStack_2588;
  long *local_2580 [2];
  long local_2570 [2];
  long *local_2560 [2];
  long local_2550 [2];
  long *local_2540 [2];
  long local_2530 [2];
  long *local_2520 [2];
  long local_2510 [2];
  long *local_2500 [2];
  long local_24f0 [2];
  long *local_24e0 [2];
  long local_24d0 [2];
  long *local_24c0 [2];
  long local_24b0 [2];
  long *local_24a0 [2];
  long local_2490 [2];
  long *local_2480 [2];
  long local_2470 [2];
  long *local_2460 [2];
  long local_2450 [2];
  long *local_2440 [2];
  long local_2430 [2];
  long *local_2420 [2];
  long local_2410 [2];
  long *local_2400 [2];
  long local_23f0 [2];
  long *local_23e0 [2];
  long local_23d0 [2];
  long *local_23c0 [2];
  long local_23b0 [2];
  long *local_23a0 [2];
  long local_2390 [2];
  long *local_2380 [2];
  long local_2370 [2];
  long *local_2360 [2];
  long local_2350 [2];
  long *local_2340 [2];
  long local_2330 [2];
  long *local_2320 [2];
  long local_2310 [2];
  long *local_2300 [2];
  long local_22f0 [2];
  long *local_22e0 [2];
  long local_22d0 [2];
  long *local_22c0 [2];
  long local_22b0 [2];
  long *local_22a0 [2];
  long local_2290 [2];
  long *local_2280 [2];
  long local_2270 [2];
  long *local_2260 [2];
  long local_2250 [2];
  long *local_2240 [2];
  long local_2230 [2];
  long *local_2220 [2];
  long local_2210 [2];
  long *local_2200 [2];
  long local_21f0 [2];
  long *local_21e0 [2];
  long local_21d0 [2];
  long *local_21c0 [2];
  long local_21b0 [2];
  long *local_21a0 [2];
  long local_2190 [2];
  long *local_2180 [2];
  long local_2170 [2];
  long *local_2160 [2];
  long local_2150 [2];
  long *local_2140 [2];
  long local_2130 [2];
  long *local_2120 [2];
  long local_2110 [2];
  long *local_2100 [2];
  long local_20f0 [2];
  long *local_20e0 [2];
  long local_20d0 [2];
  long *local_20c0 [2];
  long local_20b0 [2];
  long *local_20a0 [2];
  long local_2090 [2];
  long *local_2080 [2];
  long local_2070 [2];
  long *local_2060 [2];
  long local_2050 [2];
  long *local_2040 [2];
  long local_2030 [2];
  long *local_2020 [2];
  long local_2010 [2];
  long *local_2000 [2];
  long local_1ff0 [2];
  long *local_1fe0 [2];
  long local_1fd0 [2];
  long *local_1fc0 [2];
  long local_1fb0 [2];
  long *local_1fa0 [2];
  long local_1f90 [2];
  long *local_1f80 [2];
  long local_1f70 [2];
  long *local_1f60 [2];
  long local_1f50 [2];
  long *local_1f40 [2];
  long local_1f30 [2];
  long *local_1f20 [2];
  long local_1f10 [2];
  long *local_1f00 [2];
  long local_1ef0 [2];
  long *local_1ee0 [2];
  long local_1ed0 [2];
  long *local_1ec0 [2];
  long local_1eb0 [2];
  long *local_1ea0 [2];
  long local_1e90 [2];
  long *local_1e80 [2];
  long local_1e70 [2];
  long *local_1e60 [2];
  long local_1e50 [2];
  long *local_1e40 [2];
  long local_1e30 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e20;
  long *local_1e00 [2];
  long local_1df0 [2];
  pointer local_1de0 [2];
  undefined1 local_1dd0 [152];
  RPCResult local_1d38;
  RPCResult local_1cb0;
  RPCResult local_1c28;
  RPCResult local_1ba0;
  long *local_1b18 [2];
  long local_1b08 [2];
  long *local_1af8 [2];
  long local_1ae8 [2];
  long *local_1ad8 [2];
  long local_1ac8 [2];
  long *local_1ab8 [2];
  long local_1aa8 [2];
  long *local_1a98 [2];
  long local_1a88 [2];
  long *local_1a78 [2];
  long local_1a68 [2];
  long *local_1a58 [2];
  long local_1a48 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a38;
  long *local_1a18 [2];
  long local_1a08 [2];
  pointer local_19f8 [2];
  undefined1 local_19e8 [152];
  RPCResult local_1950;
  RPCResult local_18c8;
  RPCResult local_1840;
  RPCResult local_17b8;
  RPCResult local_1730;
  RPCResult local_16a8;
  RPCResult local_1620;
  RPCResult local_1598;
  RPCResult local_1510;
  RPCResult local_1488;
  RPCResult local_1400;
  RPCResult local_1378;
  RPCResult local_12f0;
  RPCResult local_1268;
  RPCResult local_11e0;
  RPCResult local_1158;
  RPCResult local_10d0;
  RPCResult local_1048;
  RPCResult local_fc0;
  RPCResult local_f38;
  RPCResult local_eb0;
  RPCResult local_e28;
  RPCResult local_da0;
  RPCResult local_d18;
  RPCResult local_c90;
  RPCResult local_c08;
  RPCResult local_b80;
  RPCResult local_af8;
  RPCResult local_a70;
  RPCResult local_9e8;
  long *local_960 [2];
  long local_950 [2];
  long *local_940 [2];
  long local_930 [2];
  RPCResult local_920;
  undefined1 local_898 [8];
  long *local_890 [2];
  long local_880 [2];
  undefined1 local_870 [32];
  undefined1 local_850;
  undefined1 *local_848;
  undefined8 local_840;
  undefined1 local_838;
  undefined7 uStack_837;
  undefined1 local_828 [32];
  long *local_808 [2];
  long local_7f8 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7e8;
  undefined1 local_790;
  long *local_788 [2];
  long local_778 [2];
  undefined1 local_768;
  vector<RPCArg,_std::allocator<RPCArg>_> local_760;
  undefined1 auStack_748 [8];
  undefined1 local_740 [32];
  long *local_720 [2];
  long local_710 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_700;
  undefined1 local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a0;
  RPCArg local_680;
  RPCArg local_578;
  long *local_470 [2];
  long local_460 [2];
  uint *local_450;
  undefined8 local_448;
  uint local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_430;
  undefined1 local_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [32];
  undefined2 local_330;
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1048.m_key_name.field_2._M_allocated_capacity = 0;
  local_2030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getblockstats","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nCompute per block statistics for a given window. All amounts are in satoshis.\nIt won\'t work for some heights with pruning.\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"hash_or_height","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"The block hash or height of the target block","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 1;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"string or numeric","");
  __l._M_len = 2;
  __l._M_array = &local_3b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(auStack_350 + 8),__l,&local_2799);
  local_330 = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd35c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd358;
  name._M_string_length = in_stack_ffffffffffffd360;
  name.field_2._M_allocated_capacity = (size_type)in_RDI;
  name.field_2._8_8_ = in_stack_ffffffffffffd370;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd380;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd378;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd388;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd390;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd398;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd3a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd3b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd3b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd3c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd3c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3d0;
  description_37._M_string_length = in_stack_ffffffffffffd3e0;
  description_37._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d8;
  description_37.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e8;
  description_37.field_2._8_8_ = in_stack_ffffffffffffd3f0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd400;
  opts._0_8_ = in_stack_ffffffffffffd3f8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd408;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd410;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd418;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd420;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd428;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd430;
  opts._64_8_ = in_stack_ffffffffffffd438;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_37,opts);
  pRVar43 = &local_180;
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"stats","");
  local_450 = &local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"all values","");
  local_430._0_8_ = (long)&local_430 + 0x10;
  if (local_450 == &local_440) {
    local_430._24_4_ = uStack_438;
    local_430._28_4_ = uStack_434;
  }
  else {
    local_430._0_8_ = local_450;
  }
  local_430._8_8_ = local_448;
  local_448 = 0;
  local_440 = local_440 & 0xffffff00;
  local_3d8 = 1;
  local_470[0] = local_460;
  local_450 = &local_440;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_470,"Values to plot (see result below)","");
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_6a0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"height","");
  local_700._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_6a8 = 0;
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"Selected statistic","");
  local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_768 = 0;
  local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_740._0_8_ = (pointer)0x0;
  local_740._8_2_ = 0;
  local_740._10_6_ = 0;
  local_740._16_2_ = 0;
  local_740._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd35c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd358;
  name_00._M_string_length = in_stack_ffffffffffffd360;
  name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_00.field_2._8_8_ = pRVar43;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd380;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd378;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd388;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd390;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd398;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd3a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd3b0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd3b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd3c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd3c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3d0;
  description_38._M_string_length = in_stack_ffffffffffffd3e0;
  description_38._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d8;
  description_38.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e8;
  description_38.field_2._8_8_ = in_stack_ffffffffffffd3f0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd400;
  opts_00._0_8_ = in_stack_ffffffffffffd3f8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd408;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd410;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd418;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd420;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd428;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd430;
  opts_00._64_8_ = in_stack_ffffffffffffd438;
  RPCArg::RPCArg(&local_680,name_00,(Type)&local_6a0,fallback_00,description_38,opts_00);
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"time","");
  local_7e8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_790 = 0;
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"Selected statistic","");
  local_848 = &local_838;
  local_850 = 0;
  local_840 = 0;
  local_838 = 0;
  local_828._0_8_ = (pointer)0x0;
  local_828._8_2_ = 0;
  local_828._10_6_ = 0;
  local_828._16_2_ = 0;
  local_828._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd35c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd358;
  name_01._M_string_length = in_stack_ffffffffffffd360;
  name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_01.field_2._8_8_ = pRVar43;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd380;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd378;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd388;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd390;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd398;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd3a8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd3b0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd3b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd3c0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd3c8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3d0;
  description_39._M_string_length = in_stack_ffffffffffffd3e0;
  description_39._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d8;
  description_39.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e8;
  description_39.field_2._8_8_ = in_stack_ffffffffffffd3f0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd400;
  opts_01._0_8_ = in_stack_ffffffffffffd3f8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd408;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd410;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd418;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd420;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd428;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd430;
  opts_01._64_8_ = in_stack_ffffffffffffd438;
  RPCArg::RPCArg(&local_578,name_01,(Type)local_788,fallback_01,description_39,opts_01);
  __l_00._M_len = 2;
  __l_00._M_array = &local_680;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_27b8,__l_00,&local_27b9);
  local_898[0] = 0;
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"stats","");
  puVar41 = local_898;
  local_870._16_2_ = 0;
  local_870._18_8_ = 0;
  local_870._0_8_ = (pointer)0x0;
  local_870._8_2_ = 0;
  local_870._10_6_ = 0;
  name_02._M_string_length = in_stack_ffffffffffffd360;
  name_02._M_dataplus._M_p = puVar41;
  name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_02.field_2._8_8_ = pRVar43;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd380;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd378;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd388;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd390;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd398;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd3a8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd3b0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd3b8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd3c0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd3c8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3d0;
  description_40._M_string_length = in_stack_ffffffffffffd3e0;
  description_40._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d8;
  description_40.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e8;
  description_40.field_2._8_8_ = in_stack_ffffffffffffd3f0;
  inner_36.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd400;
  inner_36.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd3f8;
  inner_36.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd408;
  RPCArg::RPCArg(&local_180,name_02,(Type)local_3d0,fallback_02,description_40,inner_36,
                 (RPCArgOptions *)0x1);
  __l_01._M_len = 2;
  __l_01._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_2798,__l_01,&local_27ba);
  local_940[0] = local_930;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"");
  local_960[0] = local_950;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"");
  local_19f8[0] = (pointer)local_19e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19f8,"avgfee","");
  uVar42 = (undefined4)((ulong)puVar41 >> 0x20);
  local_1a18[0] = local_1a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a18,"Average fee in the block","");
  local_2808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_stack_ffffffffffffd360;
  auVar4._0_4_ = uVar42;
  auVar4._12_8_ = in_RDI;
  auVar4._20_8_ = pRVar43;
  auVar4._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffd380;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_19e8 + 0x10),NUM,(string)(auVar4 << 0x20),SUB81(local_19f8,0),
             description,inner,true);
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a38,"avgfeerate","");
  local_1a58[0] = local_1a48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a58,"Average feerate (in satoshis per virtual byte)","");
  local_2828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_8_ = in_stack_ffffffffffffd360;
  auVar5._0_4_ = uVar42;
  auVar5._12_8_ = in_RDI;
  auVar5._20_8_ = pRVar43;
  auVar5._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffd380;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_00.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1950,NUM,(string)(auVar5 << 0x20),SUB81(&local_1a38,0),description_00,inner_00,
             true);
  local_1a78[0] = local_1a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a78,"avgtxsize","");
  local_1a98[0] = local_1a88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a98,"Average transaction size","");
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_8_ = in_stack_ffffffffffffd360;
  auVar6._0_4_ = uVar42;
  auVar6._12_8_ = in_RDI;
  auVar6._20_8_ = pRVar43;
  auVar6._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffd380;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_01.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_18c8,NUM,(string)(auVar6 << 0x20),SUB81(local_1a78,0),description_01,inner_01,
             true);
  local_1ab8[0] = local_1aa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ab8,"blockhash","");
  local_1ad8[0] = local_1ac8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ad8,"The block hash (to check for potential reorgs)","");
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar40 = 0;
  auVar7._4_8_ = in_stack_ffffffffffffd360;
  auVar7._0_4_ = uVar42;
  auVar7._12_8_ = in_RDI;
  auVar7._20_8_ = pRVar43;
  auVar7._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffd380;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_02.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1840,STR_HEX,(string)(auVar7 << 0x20),SUB81(local_1ab8,0),description_02,
             inner_02,true);
  local_1af8[0] = local_1ae8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1af8,"feerate_percentiles","");
  local_1b18[0] = local_1b08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b18,
             "Feerates at the 10th, 25th, 50th, 75th, and 90th percentile weight unit (in satoshis per virtual byte)"
             ,"");
  local_1de0[0] = (pointer)local_1dd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1de0,"10th_percentile_feerate","")
  ;
  local_1e00[0] = local_1df0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e00,"The 10th percentile feerate","");
  local_2898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2898.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = uVar42;
  m_key_name._M_dataplus._M_p._0_4_ = uVar40;
  m_key_name._M_string_length = in_stack_ffffffffffffd360;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name.field_2._8_8_ = pRVar43;
  description_03._M_string_length = in_stack_ffffffffffffd380;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_03.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_1dd0 + 0x10),NUM,m_key_name,description_03,inner_03,
             SUB81(local_1de0,0));
  local_1e20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1e20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e20,"25th_percentile_feerate","");
  local_1e40[0] = local_1e30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e40,"The 25th percentile feerate","");
  local_28b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = uVar42;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar40;
  m_key_name_00._M_string_length = in_stack_ffffffffffffd360;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_00.field_2._8_8_ = pRVar43;
  description_04._M_string_length = in_stack_ffffffffffffd380;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_04.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult(&local_1d38,NUM,m_key_name_00,description_04,inner_04,SUB81(&local_1e20,0));
  local_1e60[0] = local_1e50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e60,"50th_percentile_feerate","")
  ;
  local_1e80[0] = local_1e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e80,"The 50th percentile feerate","");
  local_28d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar42;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar40;
  m_key_name_01._M_string_length = in_stack_ffffffffffffd360;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_01.field_2._8_8_ = pRVar43;
  description_05._M_string_length = in_stack_ffffffffffffd380;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_05.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult(&local_1cb0,NUM,m_key_name_01,description_05,inner_05,SUB81(local_1e60,0));
  local_1ea0[0] = local_1e90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ea0,"75th_percentile_feerate","")
  ;
  local_1ec0[0] = local_1eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ec0,"The 75th percentile feerate","");
  local_28f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar42;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar40;
  m_key_name_02._M_string_length = in_stack_ffffffffffffd360;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_02.field_2._8_8_ = pRVar43;
  description_06._M_string_length = in_stack_ffffffffffffd380;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_06.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult(&local_1c28,NUM,m_key_name_02,description_06,inner_06,SUB81(local_1ea0,0));
  local_1ee0[0] = local_1ed0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ee0,"90th_percentile_feerate","")
  ;
  local_1f00[0] = local_1ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f00,"The 90th percentile feerate","");
  local_2918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar42;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar40;
  m_key_name_03._M_string_length = in_stack_ffffffffffffd360;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_03.field_2._8_8_ = pRVar43;
  description_07._M_string_length = in_stack_ffffffffffffd380;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_07.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult(&local_1ba0,NUM,m_key_name_03,description_07,inner_07,SUB81(local_1ee0,0));
  __l_02._M_len = 5;
  __l_02._M_array = (iterator)(local_1dd0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2880,__l_02,&local_2919);
  auVar8._4_8_ = in_stack_ffffffffffffd360;
  auVar8._0_4_ = uVar42;
  auVar8._12_8_ = in_RDI;
  auVar8._20_8_ = pRVar43;
  auVar8._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffd380;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_08.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_17b8,ARR_FIXED,(string)(auVar8 << 0x20),SUB81(local_1af8,0),description_08,
             inner_08,true);
  local_1f20[0] = local_1f10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f20,"height","");
  local_1f40[0] = local_1f30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f40,"The height of the block","")
  ;
  local_2938.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2938.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2938.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar9._4_8_ = in_stack_ffffffffffffd360;
  auVar9._0_4_ = uVar42;
  auVar9._12_8_ = in_RDI;
  auVar9._20_8_ = pRVar43;
  auVar9._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffd380;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_09.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1730,NUM,(string)(auVar9 << 0x20),SUB81(local_1f20,0),description_09,inner_09,
             true);
  local_1f60[0] = local_1f50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f60,"ins","");
  local_1f80[0] = local_1f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f80,"The number of inputs (excluding coinbase)","");
  local_2958.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2958.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2958.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar10._4_8_ = in_stack_ffffffffffffd360;
  auVar10._0_4_ = uVar42;
  auVar10._12_8_ = in_RDI;
  auVar10._20_8_ = pRVar43;
  auVar10._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffd380;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_10.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_16a8,NUM,(string)(auVar10 << 0x20),SUB81(local_1f60,0),description_10,inner_10,
             true);
  local_1fa0[0] = local_1f90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa0,"maxfee","");
  local_1fc0[0] = local_1fb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1fc0,"Maximum fee in the block","");
  local_2978.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2978.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2978.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar11._4_8_ = in_stack_ffffffffffffd360;
  auVar11._0_4_ = uVar42;
  auVar11._12_8_ = in_RDI;
  auVar11._20_8_ = pRVar43;
  auVar11._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffd380;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_11.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1620,NUM,(string)(auVar11 << 0x20),SUB81(local_1fa0,0),description_11,inner_11,
             true);
  local_1fe0[0] = local_1fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1fe0,"maxfeerate","");
  local_2000[0] = local_1ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2000,"Maximum feerate (in satoshis per virtual byte)","");
  local_2998.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2998.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2998.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar12._4_8_ = in_stack_ffffffffffffd360;
  auVar12._0_4_ = uVar42;
  auVar12._12_8_ = in_RDI;
  auVar12._20_8_ = pRVar43;
  auVar12._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffd380;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_12.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1598,NUM,(string)(auVar12 << 0x20),SUB81(local_1fe0,0),description_12,inner_12,
             true);
  local_2020[0] = local_2010;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2020,"maxtxsize","");
  local_2040[0] = local_2030;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2040,"Maximum transaction size","");
  local_29b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar13._4_8_ = in_stack_ffffffffffffd360;
  auVar13._0_4_ = uVar42;
  auVar13._12_8_ = in_RDI;
  auVar13._20_8_ = pRVar43;
  auVar13._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffd380;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_13.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1510,NUM,(string)(auVar13 << 0x20),SUB81(local_2020,0),description_13,inner_13,
             true);
  local_2060[0] = local_2050;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2060,"medianfee","");
  local_2080[0] = local_2070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2080,"Truncated median fee in the block","");
  local_29d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar14._4_8_ = in_stack_ffffffffffffd360;
  auVar14._0_4_ = uVar42;
  auVar14._12_8_ = in_RDI;
  auVar14._20_8_ = pRVar43;
  auVar14._28_4_ = 0;
  description_14._M_string_length = in_stack_ffffffffffffd380;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_14.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1488,NUM,(string)(auVar14 << 0x20),SUB81(local_2060,0),description_14,inner_14,
             true);
  local_20a0[0] = local_2090;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20a0,"mediantime","");
  local_20c0[0] = local_20b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"The block median time past","");
  local_29f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar15._4_8_ = in_stack_ffffffffffffd360;
  auVar15._0_4_ = uVar42;
  auVar15._12_8_ = in_RDI;
  auVar15._20_8_ = pRVar43;
  auVar15._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffd380;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_15.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1400,NUM,(string)(auVar15 << 0x20),SUB81(local_20a0,0),description_15,inner_15,
             true);
  local_20e0[0] = local_20d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20e0,"mediantxsize","");
  local_2100[0] = local_20f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2100,"Truncated median transaction size","");
  local_2a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar16._4_8_ = in_stack_ffffffffffffd360;
  auVar16._0_4_ = uVar42;
  auVar16._12_8_ = in_RDI;
  auVar16._20_8_ = pRVar43;
  auVar16._28_4_ = 0;
  description_16._M_string_length = in_stack_ffffffffffffd380;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_16.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1378,NUM,(string)(auVar16 << 0x20),SUB81(local_20e0,0),description_16,inner_16,
             true);
  local_2120[0] = local_2110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2120,"minfee","");
  local_2140[0] = local_2130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2140,"Minimum fee in the block","");
  local_2a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar17._4_8_ = in_stack_ffffffffffffd360;
  auVar17._0_4_ = uVar42;
  auVar17._12_8_ = in_RDI;
  auVar17._20_8_ = pRVar43;
  auVar17._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffd380;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_17.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_12f0,NUM,(string)(auVar17 << 0x20),SUB81(local_2120,0),description_17,inner_17,
             true);
  local_2160[0] = local_2150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2160,"minfeerate","");
  local_2180[0] = local_2170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2180,"Minimum feerate (in satoshis per virtual byte)","");
  local_2a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar18._4_8_ = in_stack_ffffffffffffd360;
  auVar18._0_4_ = uVar42;
  auVar18._12_8_ = in_RDI;
  auVar18._20_8_ = pRVar43;
  auVar18._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffd380;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_18.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1268,NUM,(string)(auVar18 << 0x20),SUB81(local_2160,0),description_18,inner_18,
             true);
  local_21a0[0] = local_2190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_21a0,"mintxsize","");
  local_21c0[0] = local_21b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_21c0,"Minimum transaction size","");
  local_2a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar19._4_8_ = in_stack_ffffffffffffd360;
  auVar19._0_4_ = uVar42;
  auVar19._12_8_ = in_RDI;
  auVar19._20_8_ = pRVar43;
  auVar19._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffd380;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_19.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_19.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_11e0,NUM,(string)(auVar19 << 0x20),SUB81(local_21a0,0),description_19,inner_19,
             true);
  local_21e0[0] = local_21d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_21e0,"outs","");
  local_2200[0] = local_21f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2200,"The number of outputs","");
  local_2a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar20._4_8_ = in_stack_ffffffffffffd360;
  auVar20._0_4_ = uVar42;
  auVar20._12_8_ = in_RDI;
  auVar20._20_8_ = pRVar43;
  auVar20._28_4_ = 0;
  description_20._M_string_length = in_stack_ffffffffffffd380;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_20.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_20.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1158,NUM,(string)(auVar20 << 0x20),SUB81(local_21e0,0),description_20,inner_20,
             true);
  local_2220[0] = local_2210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2220,"subsidy","");
  local_2240[0] = local_2230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2240,"The block subsidy","");
  local_2ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar21._4_8_ = in_stack_ffffffffffffd360;
  auVar21._0_4_ = uVar42;
  auVar21._12_8_ = in_RDI;
  auVar21._20_8_ = pRVar43;
  auVar21._28_4_ = 0;
  description_21._M_string_length = in_stack_ffffffffffffd380;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_21.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_21.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_10d0,NUM,(string)(auVar21 << 0x20),SUB81(local_2220,0),description_21,inner_21,
             true);
  local_2260[0] = local_2250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2260,"swtotal_size","");
  local_2280[0] = local_2270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2280,"Total size of all segwit transactions","");
  local_2ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar22._4_8_ = in_stack_ffffffffffffd360;
  auVar22._0_4_ = uVar42;
  auVar22._12_8_ = in_RDI;
  auVar22._20_8_ = pRVar43;
  auVar22._28_4_ = 0;
  description_22._M_string_length = in_stack_ffffffffffffd380;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_22.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_22.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_1048,NUM,(string)(auVar22 << 0x20),SUB81(local_2260,0),description_22,inner_22,
             true);
  local_22a0[0] = local_2290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22a0,"swtotal_weight","");
  local_22c0[0] = local_22b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_22c0,"Total weight of all segwit transactions","");
  local_2af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar23._4_8_ = in_stack_ffffffffffffd360;
  auVar23._0_4_ = uVar42;
  auVar23._12_8_ = in_RDI;
  auVar23._20_8_ = pRVar43;
  auVar23._28_4_ = 0;
  description_23._M_string_length = in_stack_ffffffffffffd380;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_23.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_23.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_fc0,NUM,(string)(auVar23 << 0x20),SUB81(local_22a0,0),description_23,inner_23,
             true);
  local_22e0[0] = local_22d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22e0,"swtxs","");
  local_2300[0] = local_22f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2300,"The number of segwit transactions","");
  local_2b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar24._4_8_ = in_stack_ffffffffffffd360;
  auVar24._0_4_ = uVar42;
  auVar24._12_8_ = in_RDI;
  auVar24._20_8_ = pRVar43;
  auVar24._28_4_ = 0;
  description_24._M_string_length = in_stack_ffffffffffffd380;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_24.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_24.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_f38,NUM,(string)(auVar24 << 0x20),SUB81(local_22e0,0),description_24,inner_24,
             true);
  local_2320[0] = local_2310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2320,"time","");
  local_2340[0] = local_2330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2340,"The block time","");
  local_2b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar25._4_8_ = in_stack_ffffffffffffd360;
  auVar25._0_4_ = uVar42;
  auVar25._12_8_ = in_RDI;
  auVar25._20_8_ = pRVar43;
  auVar25._28_4_ = 0;
  description_25._M_string_length = in_stack_ffffffffffffd380;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_25.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_25.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_eb0,NUM,(string)(auVar25 << 0x20),SUB81(local_2320,0),description_25,inner_25,
             true);
  local_2360[0] = local_2350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2360,"total_out","");
  local_2380[0] = local_2370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2380,
             "Total amount in all outputs (excluding coinbase and thus reward [ie subsidy + totalfee])"
             ,"");
  local_2b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar26._4_8_ = in_stack_ffffffffffffd360;
  auVar26._0_4_ = uVar42;
  auVar26._12_8_ = in_RDI;
  auVar26._20_8_ = pRVar43;
  auVar26._28_4_ = 0;
  description_26._M_string_length = in_stack_ffffffffffffd380;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_26.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_26.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_e28,NUM,(string)(auVar26 << 0x20),SUB81(local_2360,0),description_26,inner_26,
             true);
  local_23a0[0] = local_2390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23a0,"total_size","");
  local_23c0[0] = local_23b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23c0,"Total size of all non-coinbase transactions","");
  local_2b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar27._4_8_ = in_stack_ffffffffffffd360;
  auVar27._0_4_ = uVar42;
  auVar27._12_8_ = in_RDI;
  auVar27._20_8_ = pRVar43;
  auVar27._28_4_ = 0;
  description_27._M_string_length = in_stack_ffffffffffffd380;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_27.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_27.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_da0,NUM,(string)(auVar27 << 0x20),SUB81(local_23a0,0),description_27,inner_27,
             true);
  local_23e0[0] = local_23d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23e0,"total_weight","");
  local_2400[0] = local_23f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2400,"Total weight of all non-coinbase transactions","");
  local_2b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar28._4_8_ = in_stack_ffffffffffffd360;
  auVar28._0_4_ = uVar42;
  auVar28._12_8_ = in_RDI;
  auVar28._20_8_ = pRVar43;
  auVar28._28_4_ = 0;
  description_28._M_string_length = in_stack_ffffffffffffd380;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_28.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_28.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_d18,NUM,(string)(auVar28 << 0x20),SUB81(local_23e0,0),description_28,inner_28,
             true);
  local_2420[0] = local_2410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2420,"totalfee","");
  local_2440[0] = local_2430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2440,"The fee total","");
  local_2bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar29._4_8_ = in_stack_ffffffffffffd360;
  auVar29._0_4_ = uVar42;
  auVar29._12_8_ = in_RDI;
  auVar29._20_8_ = pRVar43;
  auVar29._28_4_ = 0;
  description_29._M_string_length = in_stack_ffffffffffffd380;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_29.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_29.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_c90,NUM,(string)(auVar29 << 0x20),SUB81(local_2420,0),description_29,inner_29,
             true);
  local_2460[0] = local_2450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2460,"txs","");
  local_2480[0] = local_2470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2480,"The number of transactions (including coinbase)","");
  auVar30._4_8_ = in_stack_ffffffffffffd360;
  auVar30._0_4_ = uVar42;
  auVar30._12_8_ = in_RDI;
  auVar30._20_8_ = pRVar43;
  auVar30._28_4_ = 0;
  description_30._M_string_length = in_stack_ffffffffffffd380;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_30.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_30.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_c08,NUM,(string)(auVar30 << 0x20),SUB81(local_2460,0),description_30,inner_30,
             true);
  local_24a0[0] = local_2490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24a0,"utxo_increase","");
  local_24c0[0] = local_24b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_24c0,
             "The increase/decrease in the number of unspent outputs (not discounting op_return and similar)"
             ,"");
  auVar31._4_8_ = in_stack_ffffffffffffd360;
  auVar31._0_4_ = uVar42;
  auVar31._12_8_ = in_RDI;
  auVar31._20_8_ = pRVar43;
  auVar31._28_4_ = 0;
  description_31._M_string_length = in_stack_ffffffffffffd380;
  description_31._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_31.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_31.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_b80,NUM,(string)(auVar31 << 0x20),SUB81(local_24a0,0),description_31,inner_31,
             true);
  local_24e0[0] = local_24d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24e0,"utxo_size_inc","");
  local_2500[0] = local_24f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2500,
             "The increase/decrease in size for the utxo index (not discounting op_return and similar)"
             ,"");
  auVar32._4_8_ = in_stack_ffffffffffffd360;
  auVar32._0_4_ = uVar42;
  auVar32._12_8_ = in_RDI;
  auVar32._20_8_ = pRVar43;
  auVar32._28_4_ = 0;
  description_32._M_string_length = in_stack_ffffffffffffd380;
  description_32._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_32.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_32.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_af8,NUM,(string)(auVar32 << 0x20),SUB81(local_24e0,0),description_32,inner_32,
             true);
  local_2520[0] = local_2510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2520,"utxo_increase_actual","");
  local_2540[0] = local_2530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2540,
             "The increase/decrease in the number of unspent outputs, not counting unspendables","")
  ;
  pRVar48 = (pointer)0x0;
  pRVar49 = (pointer)0x0;
  pRVar50 = (pointer)0x0;
  auVar33._4_8_ = in_stack_ffffffffffffd360;
  auVar33._0_4_ = uVar42;
  auVar33._12_8_ = in_RDI;
  auVar33._20_8_ = pRVar43;
  auVar33._28_4_ = 0;
  description_33._M_string_length = in_stack_ffffffffffffd380;
  description_33._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_33.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_33.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd3a8;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_a70,NUM,(string)(auVar33 << 0x20),SUB81(local_2520,0),description_33,inner_33,
             true);
  local_2560[0] = local_2550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2560,"utxo_size_inc_actual","");
  local_2580[0] = local_2570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2580,
             "The increase/decrease in size for the utxo index, not counting unspendables","");
  pRVar45 = (pointer)0x0;
  pRVar46 = (pointer)0x0;
  pRVar47 = (pointer)0x0;
  uVar40 = 0;
  auVar34._4_8_ = in_stack_ffffffffffffd360;
  auVar34._0_4_ = uVar42;
  auVar34._12_8_ = in_RDI;
  auVar34._20_8_ = pRVar43;
  auVar34._28_4_ = 0;
  description_34._M_string_length = in_stack_ffffffffffffd380;
  description_34._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_34.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_34.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult
            (&local_9e8,NUM,(string)(auVar34 << 0x20),SUB81(local_2560,0),description_34,inner_34,
             true);
  __l_03._M_len = 0x1f;
  __l_03._M_array = (iterator)(local_19e8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_27f0,__l_03,(allocator_type *)&stack0xffffffffffffd3a7);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar42;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar40;
  m_key_name_04._M_string_length = in_stack_ffffffffffffd360;
  m_key_name_04.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_04.field_2._8_8_ = pRVar43;
  description_35._M_string_length = in_stack_ffffffffffffd380;
  description_35._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd378;
  description_35.field_2._M_allocated_capacity = in_stack_ffffffffffffd388;
  description_35.field_2._8_8_ = in_stack_ffffffffffffd390;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar45;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd398._0_8_;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd398._8_8_;
  RPCResult::RPCResult(&local_920,OBJ,m_key_name_04,description_35,inner_35,SUB81(local_940,0));
  result._4_4_ = uVar42;
  result.m_type = uVar40;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd360;
  result.m_key_name._M_string_length = (size_type)in_RDI;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)pRVar43;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffd378;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd380;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd388;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd390;
  result.m_optional = (bool)in_stack_ffffffffffffd398[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffd398[1];
  result._66_6_ = in_stack_ffffffffffffd398._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd398._8_8_;
  result.m_description._M_string_length = (size_type)pRVar45;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar46;
  result.m_description.field_2._8_8_ = pRVar47;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3c0;
  result.m_cond._M_string_length = (size_type)pRVar48;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar49;
  result.m_cond.field_2._8_8_ = pRVar50;
  RPCResults::RPCResults(&local_27d8,result);
  local_2640._M_dataplus._M_p = (pointer)&local_2640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2640,"getblockstats","");
  local_2660._M_dataplus._M_p = (pointer)&local_2660.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2660,
             "\'\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"\' \'[\"minfeerate\",\"avgfeerate\"]\'"
             ,"");
  HelpExampleCli(&local_2620,&local_2640,&local_2660);
  local_26a0._M_dataplus._M_p = (pointer)&local_26a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_26a0,"getblockstats","");
  local_26c0._M_dataplus._M_p = (pointer)&local_26c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_26c0,"1000 \'[\"minfeerate\",\"avgfeerate\"]\'","");
  HelpExampleCli(&local_2680,&local_26a0,&local_26c0);
  uVar38 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2620._M_dataplus._M_p != &local_2620.field_2) {
    uVar38 = local_2620.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar38 < local_2680._M_string_length + local_2620._M_string_length) {
    uVar38 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2680._M_dataplus._M_p != &local_2680.field_2) {
      uVar38 = local_2680.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar38 < local_2680._M_string_length + local_2620._M_string_length)
    goto LAB_009bd13a;
    pbVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_2680,0,0,local_2620._M_dataplus._M_p,local_2620._M_string_length);
  }
  else {
LAB_009bd13a:
    pbVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_2620,local_2680._M_dataplus._M_p,local_2680._M_string_length);
  }
  local_2600._M_dataplus._M_p = (pointer)&local_2600.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar35->_M_dataplus)._M_p;
  paVar1 = &pbVar35->field_2;
  if (paVar2 == paVar1) {
    local_2600.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_2600.field_2._8_4_ = *(undefined4 *)((long)&pbVar35->field_2 + 8);
    local_2600.field_2._12_4_ = *(undefined4 *)((long)&pbVar35->field_2 + 0xc);
  }
  else {
    local_2600.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_2600._M_dataplus._M_p = (pointer)paVar2;
  }
  local_2600._M_string_length = pbVar35->_M_string_length;
  (pbVar35->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar35->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_2700._M_dataplus._M_p = (pointer)&local_2700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2700,"getblockstats","");
  local_2720._M_dataplus._M_p = (pointer)&local_2720.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2720,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\", [\"minfeerate\",\"avgfeerate\"]"
             ,"");
  HelpExampleRpc(&local_26e0,&local_2700,&local_2720);
  uVar38 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2600._M_dataplus._M_p != &local_2600.field_2) {
    uVar38 = local_2600.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar38 < local_26e0._M_string_length + local_2600._M_string_length) {
    uVar38 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_26e0._M_dataplus._M_p != &local_26e0.field_2) {
      uVar38 = local_26e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar38 < local_26e0._M_string_length + local_2600._M_string_length)
    goto LAB_009bd273;
    pbVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_26e0,0,0,local_2600._M_dataplus._M_p,local_2600._M_string_length);
  }
  else {
LAB_009bd273:
    pbVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_2600,local_26e0._M_dataplus._M_p,local_26e0._M_string_length);
  }
  local_25e0._M_dataplus._M_p = (pointer)&local_25e0.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar35->_M_dataplus)._M_p;
  paVar1 = &pbVar35->field_2;
  if (paVar2 == paVar1) {
    local_25e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_25e0.field_2._8_4_ = *(undefined4 *)((long)&pbVar35->field_2 + 8);
    local_25e0.field_2._12_4_ = *(undefined4 *)((long)&pbVar35->field_2 + 0xc);
  }
  else {
    local_25e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_25e0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_25e0._M_string_length = pbVar35->_M_string_length;
  (pbVar35->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar35->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_2760._M_dataplus._M_p = (pointer)&local_2760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2760,"getblockstats","");
  local_2780._M_dataplus._M_p = (pointer)&local_2780.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2780,"1000, [\"minfeerate\",\"avgfeerate\"]","");
  HelpExampleRpc(&local_2740,&local_2760,&local_2780);
  uVar38 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25e0._M_dataplus._M_p != &local_25e0.field_2) {
    uVar38 = local_25e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar38 < local_2740._M_string_length + local_25e0._M_string_length) {
    uVar38 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2740._M_dataplus._M_p != &local_2740.field_2) {
      uVar38 = local_2740.field_2._M_allocated_capacity;
    }
    if (local_2740._M_string_length + local_25e0._M_string_length <= (ulong)uVar38) {
      pbVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_2740,0,0,local_25e0._M_dataplus._M_p,local_25e0._M_string_length);
      goto LAB_009bd3d4;
    }
  }
  pbVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_25e0,local_2740._M_dataplus._M_p,local_2740._M_string_length);
LAB_009bd3d4:
  local_25c0 = &local_25b0;
  puVar3 = (ulong *)(pbVar35->_M_dataplus)._M_p;
  paVar1 = &pbVar35->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_25b0 = paVar1->_M_allocated_capacity;
    uStack_25a8 = *(undefined8 *)((long)&pbVar35->field_2 + 8);
  }
  else {
    local_25b0 = paVar1->_M_allocated_capacity;
    local_25c0 = puVar3;
  }
  local_2598 = pbVar35->_M_string_length;
  (pbVar35->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar35->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_25c0 == &local_25b0) {
    uStack_2588 = uStack_25a8;
    local_25a0 = &local_2590;
  }
  else {
    local_25a0 = local_25c0;
  }
  local_2590 = local_25b0;
  local_25b8 = 0;
  local_25b0 = local_25b0 & 0xffffffffffffff00;
  pcVar44 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1898:9)>
            ::_M_manager;
  name_03._M_string_length = in_stack_ffffffffffffd360;
  name_03._M_dataplus._M_p = &stack0xffffffffffffd378;
  name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_03.field_2._8_8_ = pRVar43;
  description_36.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1898:9)>
       ::_M_manager;
  description_36._M_dataplus._M_p = (pointer)0x0;
  description_36._M_string_length = 0;
  description_36.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1898:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar45;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffd398._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffd398._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar47;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar46;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffd3c0;
  examples.m_examples._M_string_length = (size_type)pRVar49;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar48;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar50;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffd3e0;
  local_25c0 = &local_25b0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_03,description_36,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar44 != (code *)0x0) {
    (*pcVar44)(&stack0xffffffffffffd378,&stack0xffffffffffffd378,3);
  }
  if (local_25a0 != &local_2590) {
    operator_delete(local_25a0,local_2590 + 1);
  }
  if (local_25c0 != &local_25b0) {
    operator_delete(local_25c0,local_25b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2740._M_dataplus._M_p != &local_2740.field_2) {
    operator_delete(local_2740._M_dataplus._M_p,local_2740.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2780._M_dataplus._M_p != &local_2780.field_2) {
    operator_delete(local_2780._M_dataplus._M_p,local_2780.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2760._M_dataplus._M_p != &local_2760.field_2) {
    operator_delete(local_2760._M_dataplus._M_p,local_2760.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25e0._M_dataplus._M_p != &local_25e0.field_2) {
    operator_delete(local_25e0._M_dataplus._M_p,local_25e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26e0._M_dataplus._M_p != &local_26e0.field_2) {
    operator_delete(local_26e0._M_dataplus._M_p,local_26e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2720._M_dataplus._M_p != &local_2720.field_2) {
    operator_delete(local_2720._M_dataplus._M_p,local_2720.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2700._M_dataplus._M_p != &local_2700.field_2) {
    operator_delete(local_2700._M_dataplus._M_p,local_2700.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2600._M_dataplus._M_p != &local_2600.field_2) {
    operator_delete(local_2600._M_dataplus._M_p,local_2600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2680._M_dataplus._M_p != &local_2680.field_2) {
    operator_delete(local_2680._M_dataplus._M_p,local_2680.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26c0._M_dataplus._M_p != &local_26c0.field_2) {
    operator_delete(local_26c0._M_dataplus._M_p,local_26c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26a0._M_dataplus._M_p != &local_26a0.field_2) {
    operator_delete(local_26a0._M_dataplus._M_p,local_26a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2620._M_dataplus._M_p != &local_2620.field_2) {
    operator_delete(local_2620._M_dataplus._M_p,local_2620.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2660._M_dataplus._M_p != &local_2660.field_2) {
    operator_delete(local_2660._M_dataplus._M_p,local_2660.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2640._M_dataplus._M_p != &local_2640.field_2) {
    operator_delete(local_2640._M_dataplus._M_p,local_2640.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_27d8.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_cond._M_dataplus._M_p != &local_920.m_cond.field_2) {
    operator_delete(local_920.m_cond._M_dataplus._M_p,
                    local_920.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_description._M_dataplus._M_p != &local_920.m_description.field_2) {
    operator_delete(local_920.m_description._M_dataplus._M_p,
                    local_920.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_920.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_key_name._M_dataplus._M_p != &local_920.m_key_name.field_2) {
    operator_delete(local_920.m_key_name._M_dataplus._M_p,
                    local_920.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_27f0);
  lVar37 = 0x1078;
  do {
    if ((long *)(local_19e8 + lVar37) != *(long **)((long)local_19f8 + lVar37)) {
      operator_delete(*(long **)((long)local_19f8 + lVar37),*(long *)(local_19e8 + lVar37) + 1);
    }
    if ((long *)((long)local_1a08 + lVar37) != *(long **)((long)local_1a18 + lVar37)) {
      operator_delete(*(long **)((long)local_1a18 + lVar37),*(long *)((long)local_1a08 + lVar37) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar37));
    if ((long *)((long)local_1a48 + lVar37) != *(long **)((long)local_1a58 + lVar37)) {
      operator_delete(*(long **)((long)local_1a58 + lVar37),*(long *)((long)local_1a48 + lVar37) + 1
                     );
    }
    lVar37 = lVar37 + -0x88;
  } while (lVar37 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd3a8);
  if (local_2580[0] != local_2570) {
    operator_delete(local_2580[0],local_2570[0] + 1);
  }
  if (local_2560[0] != local_2550) {
    operator_delete(local_2560[0],local_2550[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd3c8);
  if (local_2540[0] != local_2530) {
    operator_delete(local_2540[0],local_2530[0] + 1);
  }
  if (local_2520[0] != local_2510) {
    operator_delete(local_2520[0],local_2510[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd3e8);
  if (local_2500[0] != local_24f0) {
    operator_delete(local_2500[0],local_24f0[0] + 1);
  }
  if (local_24e0[0] != local_24d0) {
    operator_delete(local_24e0[0],local_24d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd408);
  if (local_24c0[0] != local_24b0) {
    operator_delete(local_24c0[0],local_24b0[0] + 1);
  }
  if (local_24a0[0] != local_2490) {
    operator_delete(local_24a0[0],local_2490[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd428);
  if (local_2480[0] != local_2470) {
    operator_delete(local_2480[0],local_2470[0] + 1);
  }
  if (local_2460[0] != local_2450) {
    operator_delete(local_2460[0],local_2450[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2bb8);
  if (local_2440[0] != local_2430) {
    operator_delete(local_2440[0],local_2430[0] + 1);
  }
  if (local_2420[0] != local_2410) {
    operator_delete(local_2420[0],local_2410[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b98);
  if (local_2400[0] != local_23f0) {
    operator_delete(local_2400[0],local_23f0[0] + 1);
  }
  if (local_23e0[0] != local_23d0) {
    operator_delete(local_23e0[0],local_23d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b78);
  if (local_23c0[0] != local_23b0) {
    operator_delete(local_23c0[0],local_23b0[0] + 1);
  }
  if (local_23a0[0] != local_2390) {
    operator_delete(local_23a0[0],local_2390[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b58);
  if (local_2380[0] != local_2370) {
    operator_delete(local_2380[0],local_2370[0] + 1);
  }
  if (local_2360[0] != local_2350) {
    operator_delete(local_2360[0],local_2350[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b38);
  if (local_2340[0] != local_2330) {
    operator_delete(local_2340[0],local_2330[0] + 1);
  }
  if (local_2320[0] != local_2310) {
    operator_delete(local_2320[0],local_2310[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b18);
  if (local_2300[0] != local_22f0) {
    operator_delete(local_2300[0],local_22f0[0] + 1);
  }
  if (local_22e0[0] != local_22d0) {
    operator_delete(local_22e0[0],local_22d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2af8);
  if (local_22c0[0] != local_22b0) {
    operator_delete(local_22c0[0],local_22b0[0] + 1);
  }
  if (local_22a0[0] != local_2290) {
    operator_delete(local_22a0[0],local_2290[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ad8);
  if (local_2280[0] != local_2270) {
    operator_delete(local_2280[0],local_2270[0] + 1);
  }
  if (local_2260[0] != local_2250) {
    operator_delete(local_2260[0],local_2250[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ab8);
  if (local_2240[0] != local_2230) {
    operator_delete(local_2240[0],local_2230[0] + 1);
  }
  if (local_2220[0] != local_2210) {
    operator_delete(local_2220[0],local_2210[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a98);
  if (local_2200[0] != local_21f0) {
    operator_delete(local_2200[0],local_21f0[0] + 1);
  }
  if (local_21e0[0] != local_21d0) {
    operator_delete(local_21e0[0],local_21d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a78);
  if (local_21c0[0] != local_21b0) {
    operator_delete(local_21c0[0],local_21b0[0] + 1);
  }
  if (local_21a0[0] != local_2190) {
    operator_delete(local_21a0[0],local_2190[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a58);
  if (local_2180[0] != local_2170) {
    operator_delete(local_2180[0],local_2170[0] + 1);
  }
  if (local_2160[0] != local_2150) {
    operator_delete(local_2160[0],local_2150[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a38);
  if (local_2140[0] != local_2130) {
    operator_delete(local_2140[0],local_2130[0] + 1);
  }
  if (local_2120[0] != local_2110) {
    operator_delete(local_2120[0],local_2110[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a18);
  if (local_2100[0] != local_20f0) {
    operator_delete(local_2100[0],local_20f0[0] + 1);
  }
  if (local_20e0[0] != local_20d0) {
    operator_delete(local_20e0[0],local_20d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29f8);
  if (local_20c0[0] != local_20b0) {
    operator_delete(local_20c0[0],local_20b0[0] + 1);
  }
  if (local_20a0[0] != local_2090) {
    operator_delete(local_20a0[0],local_2090[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29d8);
  if (local_2080[0] != local_2070) {
    operator_delete(local_2080[0],local_2070[0] + 1);
  }
  if (local_2060[0] != local_2050) {
    operator_delete(local_2060[0],local_2050[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29b8);
  if (local_2040[0] != local_2030) {
    operator_delete(local_2040[0],local_2030[0] + 1);
  }
  if (local_2020[0] != local_2010) {
    operator_delete(local_2020[0],local_2010[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2998);
  if (local_2000[0] != local_1ff0) {
    operator_delete(local_2000[0],local_1ff0[0] + 1);
  }
  if (local_1fe0[0] != local_1fd0) {
    operator_delete(local_1fe0[0],local_1fd0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2978);
  if (local_1fc0[0] != local_1fb0) {
    operator_delete(local_1fc0[0],local_1fb0[0] + 1);
  }
  if (local_1fa0[0] != local_1f90) {
    operator_delete(local_1fa0[0],local_1f90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2958);
  if (local_1f80[0] != local_1f70) {
    operator_delete(local_1f80[0],local_1f70[0] + 1);
  }
  if (local_1f60[0] != local_1f50) {
    operator_delete(local_1f60[0],local_1f50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2938);
  if (local_1f40[0] != local_1f30) {
    operator_delete(local_1f40[0],local_1f30[0] + 1);
  }
  if (local_1f20[0] != local_1f10) {
    operator_delete(local_1f20[0],local_1f10[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2880);
  lVar37 = 0x2a8;
  do {
    if ((long *)(local_1dd0 + lVar37) != *(long **)((long)local_1de0 + lVar37)) {
      operator_delete(*(long **)((long)local_1de0 + lVar37),*(long *)(local_1dd0 + lVar37) + 1);
    }
    if ((long *)((long)local_1df0 + lVar37) != *(long **)((long)local_1e00 + lVar37)) {
      operator_delete(*(long **)((long)local_1e00 + lVar37),*(long *)((long)local_1df0 + lVar37) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1e20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar37));
    if ((long *)((long)local_1e30 + lVar37) != *(long **)((long)local_1e40 + lVar37)) {
      operator_delete(*(long **)((long)local_1e40 + lVar37),*(long *)((long)local_1e30 + lVar37) + 1
                     );
    }
    lVar37 = lVar37 + -0x88;
  } while (lVar37 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2918);
  if (local_1f00[0] != local_1ef0) {
    operator_delete(local_1f00[0],local_1ef0[0] + 1);
  }
  if (local_1ee0[0] != local_1ed0) {
    operator_delete(local_1ee0[0],local_1ed0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28f8);
  if (local_1ec0[0] != local_1eb0) {
    operator_delete(local_1ec0[0],local_1eb0[0] + 1);
  }
  if (local_1ea0[0] != local_1e90) {
    operator_delete(local_1ea0[0],local_1e90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28d8);
  if (local_1e80[0] != local_1e70) {
    operator_delete(local_1e80[0],local_1e70[0] + 1);
  }
  if (local_1e60[0] != local_1e50) {
    operator_delete(local_1e60[0],local_1e50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28b8);
  if (local_1e40[0] != local_1e30) {
    operator_delete(local_1e40[0],local_1e30[0] + 1);
  }
  if (local_1e20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1e20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1e20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1e20.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2898);
  if (local_1e00[0] != local_1df0) {
    operator_delete(local_1e00[0],local_1df0[0] + 1);
  }
  if (local_1de0[0] != (pointer)local_1dd0) {
    operator_delete(local_1de0[0],local_1dd0._0_8_ + 1);
  }
  if (local_1b18[0] != local_1b08) {
    operator_delete(local_1b18[0],local_1b08[0] + 1);
  }
  if (local_1af8[0] != local_1ae8) {
    operator_delete(local_1af8[0],local_1ae8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2868);
  if (local_1ad8[0] != local_1ac8) {
    operator_delete(local_1ad8[0],local_1ac8[0] + 1);
  }
  if (local_1ab8[0] != local_1aa8) {
    operator_delete(local_1ab8[0],local_1aa8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2848);
  if (local_1a98[0] != local_1a88) {
    operator_delete(local_1a98[0],local_1a88[0] + 1);
  }
  if (local_1a78[0] != local_1a68) {
    operator_delete(local_1a78[0],local_1a68[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2828);
  if (local_1a58[0] != local_1a48) {
    operator_delete(local_1a58[0],local_1a48[0] + 1);
  }
  if (local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1a38.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2808);
  if (local_1a18[0] != local_1a08) {
    operator_delete(local_1a18[0],local_1a08[0] + 1);
  }
  if (local_19f8[0] != (pointer)local_19e8) {
    operator_delete(local_19f8[0],local_19e8._0_8_ + 1);
  }
  if (local_960[0] != local_950) {
    operator_delete(local_960[0],local_950[0] + 1);
  }
  if (local_940[0] != local_930) {
    operator_delete(local_940[0],local_930[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_2798);
  lVar37 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar37));
    plVar39 = *(long **)((long)&local_308 + lVar37 + 0x40);
    plVar36 = (long *)((long)&local_308 + lVar37 + 0x50);
    if (plVar36 != plVar39) {
      operator_delete(plVar39,*plVar36 + 1);
    }
    plVar36 = (long *)((long)&local_308 + lVar37 + 0x28);
    plVar39 = *(long **)((long)&local_308 + lVar37 + 0x18);
    if (plVar36 != plVar39) {
      operator_delete(plVar39,*plVar36 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar37));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar37));
    if ((long *)((long)local_380 + lVar37) != *(long **)((long)local_390 + lVar37)) {
      operator_delete(*(long **)((long)local_390 + lVar37),*(long *)((long)local_380 + lVar37) + 1);
    }
    lVar37 = lVar37 + -0x108;
  } while (lVar37 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_870);
  if (local_890[0] != local_880) {
    operator_delete(local_890[0],local_880[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_27b8);
  lVar37 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_6a0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar37));
    plVar39 = *(long **)((long)&local_700 + lVar37 + 0x40);
    plVar36 = (long *)((long)&local_700 + lVar37 + 0x50);
    if (plVar36 != plVar39) {
      operator_delete(plVar39,*plVar36 + 1);
    }
    plVar36 = (long *)((long)&local_700 + lVar37 + 0x28);
    plVar39 = *(long **)((long)&local_700 + lVar37 + 0x18);
    if (plVar36 != plVar39) {
      operator_delete(plVar39,*plVar36 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_748 + lVar37));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar37));
    if ((long *)((long)local_778 + lVar37) != *(long **)((long)local_788 + lVar37)) {
      operator_delete(*(long **)((long)local_788 + lVar37),*(long *)((long)local_778 + lVar37) + 1);
    }
    lVar37 = lVar37 + -0x108;
  } while (lVar37 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_828);
  if (local_848 != &local_838) {
    operator_delete(local_848,CONCAT71(uStack_837,local_838) + 1);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7e8._M_first);
  if (local_788[0] != local_778) {
    operator_delete(local_788[0],local_778[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_740);
  if (local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_760.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_720[0] != local_710) {
    operator_delete(local_720[0],local_710[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_700._M_first);
  if (local_6a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_6a0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_6a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_6a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_430._M_first);
  if (local_450 != &local_440) {
    operator_delete(local_450,CONCAT44(uStack_43c,local_440) + 1);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(auStack_350 + 8));
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  lVar37 = -0x40;
  plVar39 = local_380;
  do {
    if (plVar39 != (long *)plVar39[-2]) {
      operator_delete((long *)plVar39[-2],*plVar39 + 1);
    }
    plVar39 = plVar39 + -4;
    lVar37 = lVar37 + 0x20;
  } while (lVar37 != 0);
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockstats()
{
    return RPCHelpMan{"getblockstats",
                "\nCompute per block statistics for a given window. All amounts are in satoshis.\n"
                "It won't work for some heights with pruning.\n",
                {
                    {"hash_or_height", RPCArg::Type::NUM, RPCArg::Optional::NO, "The block hash or height of the target block",
                     RPCArgOptions{
                         .skip_type_check = true,
                         .type_str = {"", "string or numeric"},
                     }},
                    {"stats", RPCArg::Type::ARR, RPCArg::DefaultHint{"all values"}, "Values to plot (see result below)",
                        {
                            {"height", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Selected statistic"},
                            {"time", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Selected statistic"},
                        },
                        RPCArgOptions{.oneline_description="stats"}},
                },
                RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::NUM, "avgfee", /*optional=*/true, "Average fee in the block"},
                {RPCResult::Type::NUM, "avgfeerate", /*optional=*/true, "Average feerate (in satoshis per virtual byte)"},
                {RPCResult::Type::NUM, "avgtxsize", /*optional=*/true, "Average transaction size"},
                {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "The block hash (to check for potential reorgs)"},
                {RPCResult::Type::ARR_FIXED, "feerate_percentiles", /*optional=*/true, "Feerates at the 10th, 25th, 50th, 75th, and 90th percentile weight unit (in satoshis per virtual byte)",
                {
                    {RPCResult::Type::NUM, "10th_percentile_feerate", "The 10th percentile feerate"},
                    {RPCResult::Type::NUM, "25th_percentile_feerate", "The 25th percentile feerate"},
                    {RPCResult::Type::NUM, "50th_percentile_feerate", "The 50th percentile feerate"},
                    {RPCResult::Type::NUM, "75th_percentile_feerate", "The 75th percentile feerate"},
                    {RPCResult::Type::NUM, "90th_percentile_feerate", "The 90th percentile feerate"},
                }},
                {RPCResult::Type::NUM, "height", /*optional=*/true, "The height of the block"},
                {RPCResult::Type::NUM, "ins", /*optional=*/true, "The number of inputs (excluding coinbase)"},
                {RPCResult::Type::NUM, "maxfee", /*optional=*/true, "Maximum fee in the block"},
                {RPCResult::Type::NUM, "maxfeerate", /*optional=*/true, "Maximum feerate (in satoshis per virtual byte)"},
                {RPCResult::Type::NUM, "maxtxsize", /*optional=*/true, "Maximum transaction size"},
                {RPCResult::Type::NUM, "medianfee", /*optional=*/true, "Truncated median fee in the block"},
                {RPCResult::Type::NUM, "mediantime", /*optional=*/true, "The block median time past"},
                {RPCResult::Type::NUM, "mediantxsize", /*optional=*/true, "Truncated median transaction size"},
                {RPCResult::Type::NUM, "minfee", /*optional=*/true, "Minimum fee in the block"},
                {RPCResult::Type::NUM, "minfeerate", /*optional=*/true, "Minimum feerate (in satoshis per virtual byte)"},
                {RPCResult::Type::NUM, "mintxsize", /*optional=*/true, "Minimum transaction size"},
                {RPCResult::Type::NUM, "outs", /*optional=*/true, "The number of outputs"},
                {RPCResult::Type::NUM, "subsidy", /*optional=*/true, "The block subsidy"},
                {RPCResult::Type::NUM, "swtotal_size", /*optional=*/true, "Total size of all segwit transactions"},
                {RPCResult::Type::NUM, "swtotal_weight", /*optional=*/true, "Total weight of all segwit transactions"},
                {RPCResult::Type::NUM, "swtxs", /*optional=*/true, "The number of segwit transactions"},
                {RPCResult::Type::NUM, "time", /*optional=*/true, "The block time"},
                {RPCResult::Type::NUM, "total_out", /*optional=*/true, "Total amount in all outputs (excluding coinbase and thus reward [ie subsidy + totalfee])"},
                {RPCResult::Type::NUM, "total_size", /*optional=*/true, "Total size of all non-coinbase transactions"},
                {RPCResult::Type::NUM, "total_weight", /*optional=*/true, "Total weight of all non-coinbase transactions"},
                {RPCResult::Type::NUM, "totalfee", /*optional=*/true, "The fee total"},
                {RPCResult::Type::NUM, "txs", /*optional=*/true, "The number of transactions (including coinbase)"},
                {RPCResult::Type::NUM, "utxo_increase", /*optional=*/true, "The increase/decrease in the number of unspent outputs (not discounting op_return and similar)"},
                {RPCResult::Type::NUM, "utxo_size_inc", /*optional=*/true, "The increase/decrease in size for the utxo index (not discounting op_return and similar)"},
                {RPCResult::Type::NUM, "utxo_increase_actual", /*optional=*/true, "The increase/decrease in the number of unspent outputs, not counting unspendables"},
                {RPCResult::Type::NUM, "utxo_size_inc_actual", /*optional=*/true, "The increase/decrease in size for the utxo index, not counting unspendables"},
            }},
                RPCExamples{
                    HelpExampleCli("getblockstats", R"('"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09"' '["minfeerate","avgfeerate"]')") +
                    HelpExampleCli("getblockstats", R"(1000 '["minfeerate","avgfeerate"]')") +
                    HelpExampleRpc("getblockstats", R"("00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09", ["minfeerate","avgfeerate"])") +
                    HelpExampleRpc("getblockstats", R"(1000, ["minfeerate","avgfeerate"])")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    const CBlockIndex& pindex{*CHECK_NONFATAL(ParseHashOrHeight(request.params[0], chainman))};

    std::set<std::string> stats;
    if (!request.params[1].isNull()) {
        const UniValue stats_univalue = request.params[1].get_array();
        for (unsigned int i = 0; i < stats_univalue.size(); i++) {
            const std::string stat = stats_univalue[i].get_str();
            stats.insert(stat);
        }
    }

    const CBlock& block = GetBlockChecked(chainman.m_blockman, pindex);
    const CBlockUndo& blockUndo = GetUndoChecked(chainman.m_blockman, pindex);

    const bool do_all = stats.size() == 0; // Calculate everything if nothing selected (default)
    const bool do_mediantxsize = do_all || stats.count("mediantxsize") != 0;
    const bool do_medianfee = do_all || stats.count("medianfee") != 0;
    const bool do_feerate_percentiles = do_all || stats.count("feerate_percentiles") != 0;
    const bool loop_inputs = do_all || do_medianfee || do_feerate_percentiles ||
        SetHasKeys(stats, "utxo_increase", "utxo_increase_actual", "utxo_size_inc", "utxo_size_inc_actual", "totalfee", "avgfee", "avgfeerate", "minfee", "maxfee", "minfeerate", "maxfeerate");
    const bool loop_outputs = do_all || loop_inputs || stats.count("total_out");
    const bool do_calculate_size = do_mediantxsize ||
        SetHasKeys(stats, "total_size", "avgtxsize", "mintxsize", "maxtxsize", "swtotal_size");
    const bool do_calculate_weight = do_all || SetHasKeys(stats, "total_weight", "avgfeerate", "swtotal_weight", "avgfeerate", "feerate_percentiles", "minfeerate", "maxfeerate");
    const bool do_calculate_sw = do_all || SetHasKeys(stats, "swtxs", "swtotal_size", "swtotal_weight");

    CAmount maxfee = 0;
    CAmount maxfeerate = 0;
    CAmount minfee = MAX_MONEY;
    CAmount minfeerate = MAX_MONEY;
    CAmount total_out = 0;
    CAmount totalfee = 0;
    int64_t inputs = 0;
    int64_t maxtxsize = 0;
    int64_t mintxsize = MAX_BLOCK_SERIALIZED_SIZE;
    int64_t outputs = 0;
    int64_t swtotal_size = 0;
    int64_t swtotal_weight = 0;
    int64_t swtxs = 0;
    int64_t total_size = 0;
    int64_t total_weight = 0;
    int64_t utxos = 0;
    int64_t utxo_size_inc = 0;
    int64_t utxo_size_inc_actual = 0;
    std::vector<CAmount> fee_array;
    std::vector<std::pair<CAmount, int64_t>> feerate_array;
    std::vector<int64_t> txsize_array;

    for (size_t i = 0; i < block.vtx.size(); ++i) {
        const auto& tx = block.vtx.at(i);
        outputs += tx->vout.size();

        CAmount tx_total_out = 0;
        if (loop_outputs) {
            for (const CTxOut& out : tx->vout) {
                tx_total_out += out.nValue;

                size_t out_size = GetSerializeSize(out) + PER_UTXO_OVERHEAD;
                utxo_size_inc += out_size;

                // The Genesis block and the repeated BIP30 block coinbases don't change the UTXO
                // set counts, so they have to be excluded from the statistics
                if (pindex.nHeight == 0 || (IsBIP30Repeat(pindex) && tx->IsCoinBase())) continue;
                // Skip unspendable outputs since they are not included in the UTXO set
                if (out.scriptPubKey.IsUnspendable()) continue;

                ++utxos;
                utxo_size_inc_actual += out_size;
            }
        }

        if (tx->IsCoinBase()) {
            continue;
        }

        inputs += tx->vin.size(); // Don't count coinbase's fake input
        total_out += tx_total_out; // Don't count coinbase reward

        int64_t tx_size = 0;
        if (do_calculate_size) {

            tx_size = tx->GetTotalSize();
            if (do_mediantxsize) {
                txsize_array.push_back(tx_size);
            }
            maxtxsize = std::max(maxtxsize, tx_size);
            mintxsize = std::min(mintxsize, tx_size);
            total_size += tx_size;
        }

        int64_t weight = 0;
        if (do_calculate_weight) {
            weight = GetTransactionWeight(*tx);
            total_weight += weight;
        }

        if (do_calculate_sw && tx->HasWitness()) {
            ++swtxs;
            swtotal_size += tx_size;
            swtotal_weight += weight;
        }

        if (loop_inputs) {
            CAmount tx_total_in = 0;
            const auto& txundo = blockUndo.vtxundo.at(i - 1);
            for (const Coin& coin: txundo.vprevout) {
                const CTxOut& prevoutput = coin.out;

                tx_total_in += prevoutput.nValue;
                size_t prevout_size = GetSerializeSize(prevoutput) + PER_UTXO_OVERHEAD;
                utxo_size_inc -= prevout_size;
                utxo_size_inc_actual -= prevout_size;
            }

            CAmount txfee = tx_total_in - tx_total_out;
            CHECK_NONFATAL(MoneyRange(txfee));
            if (do_medianfee) {
                fee_array.push_back(txfee);
            }
            maxfee = std::max(maxfee, txfee);
            minfee = std::min(minfee, txfee);
            totalfee += txfee;

            // New feerate uses satoshis per virtual byte instead of per serialized byte
            CAmount feerate = weight ? (txfee * WITNESS_SCALE_FACTOR) / weight : 0;
            if (do_feerate_percentiles) {
                feerate_array.emplace_back(feerate, weight);
            }
            maxfeerate = std::max(maxfeerate, feerate);
            minfeerate = std::min(minfeerate, feerate);
        }
    }

    CAmount feerate_percentiles[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    CalculatePercentilesByWeight(feerate_percentiles, feerate_array, total_weight);

    UniValue feerates_res(UniValue::VARR);
    for (int64_t i = 0; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        feerates_res.push_back(feerate_percentiles[i]);
    }

    UniValue ret_all(UniValue::VOBJ);
    ret_all.pushKV("avgfee", (block.vtx.size() > 1) ? totalfee / (block.vtx.size() - 1) : 0);
    ret_all.pushKV("avgfeerate", total_weight ? (totalfee * WITNESS_SCALE_FACTOR) / total_weight : 0); // Unit: sat/vbyte
    ret_all.pushKV("avgtxsize", (block.vtx.size() > 1) ? total_size / (block.vtx.size() - 1) : 0);
    ret_all.pushKV("blockhash", pindex.GetBlockHash().GetHex());
    ret_all.pushKV("feerate_percentiles", std::move(feerates_res));
    ret_all.pushKV("height", (int64_t)pindex.nHeight);
    ret_all.pushKV("ins", inputs);
    ret_all.pushKV("maxfee", maxfee);
    ret_all.pushKV("maxfeerate", maxfeerate);
    ret_all.pushKV("maxtxsize", maxtxsize);
    ret_all.pushKV("medianfee", CalculateTruncatedMedian(fee_array));
    ret_all.pushKV("mediantime", pindex.GetMedianTimePast());
    ret_all.pushKV("mediantxsize", CalculateTruncatedMedian(txsize_array));
    ret_all.pushKV("minfee", (minfee == MAX_MONEY) ? 0 : minfee);
    ret_all.pushKV("minfeerate", (minfeerate == MAX_MONEY) ? 0 : minfeerate);
    ret_all.pushKV("mintxsize", mintxsize == MAX_BLOCK_SERIALIZED_SIZE ? 0 : mintxsize);
    ret_all.pushKV("outs", outputs);
    ret_all.pushKV("subsidy", GetBlockSubsidy(pindex.nHeight, chainman.GetParams().GetConsensus()));
    ret_all.pushKV("swtotal_size", swtotal_size);
    ret_all.pushKV("swtotal_weight", swtotal_weight);
    ret_all.pushKV("swtxs", swtxs);
    ret_all.pushKV("time", pindex.GetBlockTime());
    ret_all.pushKV("total_out", total_out);
    ret_all.pushKV("total_size", total_size);
    ret_all.pushKV("total_weight", total_weight);
    ret_all.pushKV("totalfee", totalfee);
    ret_all.pushKV("txs", (int64_t)block.vtx.size());
    ret_all.pushKV("utxo_increase", outputs - inputs);
    ret_all.pushKV("utxo_size_inc", utxo_size_inc);
    ret_all.pushKV("utxo_increase_actual", utxos - inputs);
    ret_all.pushKV("utxo_size_inc_actual", utxo_size_inc_actual);

    if (do_all) {
        return ret_all;
    }

    UniValue ret(UniValue::VOBJ);
    for (const std::string& stat : stats) {
        const UniValue& value = ret_all[stat];
        if (value.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid selected statistic '%s'", stat));
        }
        ret.pushKV(stat, value);
    }
    return ret;
},
    };
}